

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O3

string * OB::Euarel::url_decode(string *__return_storage_ptr__,string *str,bool form)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  long *local_70 [2];
  long local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined1 local_44 [4];
  string *psStack_40;
  uint n;
  uint local_34;
  ulong uVar5;
  
  local_34 = (uint)CONCAT71(in_register_00000011,form);
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psStack_40 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = str->_M_string_length;
  if (uVar3 != 0) {
    local_34 = local_34 ^ 1;
    uVar4 = 0;
    do {
      pcVar1 = (str->_M_dataplus)._M_p;
      if (pcVar1[uVar4] == '+' && (char)local_34 == '\0') {
        std::__cxx11::string::append((char *)psStack_40);
        uVar5 = uVar4;
      }
      else if ((((pcVar1[uVar4] == '%') && (uVar5 = uVar4 + 2, uVar5 < uVar3)) &&
               (iVar2 = isxdigit((uint)(byte)pcVar1[uVar4 + 1]), iVar2 != 0)) &&
              (iVar2 = isxdigit((uint)(byte)pcVar1[uVar5]), iVar2 != 0)) {
        std::__cxx11::string::substr((ulong)local_70,(ulong)str);
        __isoc99_sscanf(local_70[0],"%x",local_44);
        std::__cxx11::string::push_back((char)psStack_40);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
      else {
        std::__cxx11::string::push_back((char)psStack_40);
        uVar5 = uVar4;
      }
      uVar4 = uVar5 + 1;
      uVar3 = str->_M_string_length;
    } while (uVar4 < uVar3);
  }
  return psStack_40;
}

Assistant:

std::string url_decode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (std::size_t i = 0; i < str.size(); ++i)
  {
    if (str[i] == '+' && form)
    {
      res += " ";
    }
    else if (str[i] == '%' && i + 2 < str.size() &&
      std::isxdigit(static_cast<unsigned char>(str[i + 1])) &&
      std::isxdigit(static_cast<unsigned char>(str[i + 2])))
    {
      res += hex_decode(str.substr(i + 1, 2));
      i += 2;
    }
    else
    {
      res += str[i];
    }
  }

  return res;
}